

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void __thiscall LTChannel::SetValid(LTChannel *this,bool _valid,bool bMsg)

{
  logLevelTy lVar1;
  char *pcVar2;
  byte in_DL;
  byte in_SIL;
  LTChannel *in_RDI;
  
  if ((in_SIL & 1) == 0) {
    in_RDI->bValid = false;
    if ((in_DL & 1) != 0) {
      lVar1 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar1 < 5) {
        pcVar2 = ChName(in_RDI);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0xe0,"SetValid",logFATAL,"%s: Channel invalid",pcVar2);
      }
      pcVar2 = ChName(in_RDI);
      CreateMsgWindow(12.0,logFATAL,"%s: Channel invalid",pcVar2);
    }
  }
  else {
    if ((((in_RDI->bValid & 1U) == 0) && ((in_DL & 1) != 0)) &&
       (lVar1 = DataRefs::GetLogLevel(&dataRefs), (int)lVar1 < 2)) {
      pcVar2 = ChName(in_RDI);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
             ,0xd8,"SetValid",logINFO,"%s: Channel restarted",pcVar2);
    }
    in_RDI->errCnt = 0;
    in_RDI->bValid = true;
  }
  return;
}

Assistant:

void LTChannel::SetValid (bool _valid, bool bMsg)
{
    // (re)set to valid channel
    if (_valid) {
        if (!bValid && bMsg) {
            LOG_MSG(logINFO, INFO_CH_RESTART, ChName());
        }
        errCnt = 0;
        bValid = true;
    } else {
        // set invalid
        bValid = false;
        if (bMsg)
            SHOW_MSG(logFATAL,ERR_CH_INVALID,ChName());
    }
}